

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void f8n::writeTo(ostream *out,string *level,string *tag,string *message)

{
  ostream *poVar1;
  string local_48 [32];
  string *local_28;
  string *message_local;
  string *tag_local;
  string *level_local;
  ostream *out_local;
  
  local_28 = message;
  message_local = tag;
  tag_local = level;
  level_local = (string *)out;
  timestamp_abi_cxx11_();
  poVar1 = std::operator<<(out,local_48);
  poVar1 = std::operator<<(poVar1," [");
  poVar1 = std::operator<<(poVar1,(string *)tag_local);
  poVar1 = std::operator<<(poVar1,"] [");
  poVar1 = std::operator<<(poVar1,(string *)message_local);
  poVar1 = std::operator<<(poVar1,"] ");
  poVar1 = std::operator<<(poVar1,(string *)local_28);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_48);
  std::ostream::flush();
  return;
}

Assistant:

static void writeTo(
        std::ostream& out,
        const std::string& level,
        const std::string& tag,
        const std::string& message)
    {
        out << timestamp() << " [" << level << "] [" << tag << "] " << message << "\n";
        out.flush();
    }